

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibString.cpp
# Opt level: O0

int lib::string::Char(State *state)

{
  State *in_RDI;
  int i;
  string str;
  int params;
  StackAPI api;
  ValueT in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  StackAPI *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_4c;
  string local_48 [36];
  int local_24;
  StackAPI local_20;
  int local_4;
  
  luna::StackAPI::StackAPI(&local_20,in_RDI);
  local_24 = luna::StackAPI::GetStackSize(in_stack_ffffffffffffff90);
  std::__cxx11::string::string(local_48);
  local_4c = 0;
  do {
    if (local_24 <= local_4c) {
      luna::StackAPI::PushString
                ((StackAPI *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (string *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      local_4 = 1;
LAB_00166df9:
      std::__cxx11::string::~string(local_48);
      return local_4;
    }
    in_stack_ffffffffffffff9f =
         luna::StackAPI::IsNumber(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    if (!(bool)in_stack_ffffffffffffff9f) {
      luna::StackAPI::ArgTypeError
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      local_4 = 0;
      goto LAB_00166df9;
    }
    in_stack_ffffffffffffff90 =
         (StackAPI *)
         luna::StackAPI::GetNumber
                   ((StackAPI *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                    (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    std::__cxx11::string::push_back((char)local_48);
    local_4c = local_4c + 1;
  } while( true );
}

Assistant:

int Char(luna::State *state)
    {
        luna::StackAPI api(state);
        int params = api.GetStackSize();

        std::string str;
        for (int i = 0; i < params; ++i)
        {
            if (!api.IsNumber(i))
            {
                api.ArgTypeError(i, luna::ValueT_Number);
                return 0;
            }
            else
            {
                str.push_back(static_cast<int>(api.GetNumber(i)));
            }
        }

        api.PushString(str);
        return 1;
    }